

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataControllerDefault.cpp
# Opt level: O1

bool __thiscall
Rml::DataControllerEvent::Initialize
          (DataControllerEvent *this,DataModel *model,Element *element,String *expression_str,
          String *modifier)

{
  pointer pcVar1;
  code *pcVar2;
  bool bVar3;
  EventId id;
  DataModel *pDVar4;
  bool bVar5;
  DataExpressionInterface expr_interface;
  String local_68;
  DataExpressionInterface local_48;
  
  if (element == (Element *)0x0) {
    bVar3 = Assert("RMLUI_ASSERT(element)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataControllerDefault.cpp"
                   ,0x6b);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  pDVar4 = (DataModel *)operator_new(0x50);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (expression_str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + expression_str->_M_string_length);
  DataExpression::DataExpression((DataExpression *)pDVar4,&local_68);
  local_48.data_model = pDVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pDVar4 = local_48.data_model;
  local_48.data_model = (DataModel *)0x0;
  ::std::__uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::reset
            ((__uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)
             &this->expression,(pointer)pDVar4);
  ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::~unique_ptr
            ((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)&local_48
            );
  bVar5 = false;
  DataExpressionInterface::DataExpressionInterface(&local_48,model,element,(Event *)0x0);
  bVar3 = DataExpression::Parse
                    ((this->expression)._M_t.
                     super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                     .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl,&local_48,
                     true);
  if (bVar3) {
    id = EventSpecificationInterface::GetIdOrInsert(modifier);
    this->id = id;
    if (id == Invalid) {
      pcVar1 = (modifier->_M_dataplus)._M_p;
      Element::GetAddress_abi_cxx11_(&local_68,element,false,true);
      Log::Message(LT_WARNING,
                   "Event type \'%s\' could not be recognized, while adding \'data-event\' to %s",
                   pcVar1,local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      bVar5 = false;
    }
    else {
      Element::AddEventListener(element,id,&this->super_EventListener,false);
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool DataControllerEvent::Initialize(DataModel& model, Element* element, const String& expression_str, const String& modifier)
{
	RMLUI_ASSERT(element);

	expression = MakeUnique<DataExpression>(expression_str);
	DataExpressionInterface expr_interface(&model, element);

	if (!expression->Parse(expr_interface, true))
		return false;

	id = EventSpecificationInterface::GetIdOrInsert(modifier);
	if (id == EventId::Invalid)
	{
		Log::Message(Log::LT_WARNING, "Event type '%s' could not be recognized, while adding 'data-event' to %s", modifier.c_str(),
			element->GetAddress().c_str());
		return false;
	}

	element->AddEventListener(id, this);

	return true;
}